

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

void * cm_expat_XML_GetBuffer(XML_Parser parser,int len)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  void *pvVar8;
  
  lVar7 = *(long *)((long)parser + 0x40);
  if (lVar7 - *(long *)((long)parser + 0x38) < (long)len) {
    pvVar3 = *(void **)((long)parser + 0x10);
    lVar1 = *(long *)((long)parser + 0x30);
    lVar4 = *(long *)((long)parser + 0x38) - lVar1;
    iVar6 = (int)(lVar1 - (long)pvVar3);
    iVar2 = 0x400;
    if (iVar6 < 0x400) {
      iVar2 = iVar6;
    }
    iVar5 = len + (int)lVar4 + iVar2;
    if (lVar7 - (long)pvVar3 < (long)iVar5) {
      iVar2 = (int)lVar7 - (int)lVar1;
      if (iVar2 == 0) {
        iVar2 = 0x400;
      }
      do {
        iVar2 = iVar2 * 2;
      } while (iVar2 < iVar5);
      pvVar3 = (void *)(**(code **)((long)parser + 0x18))((long)iVar2);
      if (pvVar3 == (void *)0x0) {
        *(undefined4 *)((long)parser + 0x210) = 1;
      }
      else {
        *(long *)((long)parser + 0x40) = (long)iVar2 + (long)pvVar3;
        lVar7 = *(long *)((long)parser + 0x30);
        if (lVar7 == 0) {
          *(long *)((long)parser + 0x38) = *(long *)((long)parser + 0x38) + (long)pvVar3;
          *(void **)((long)parser + 0x10) = pvVar3;
          pvVar8 = pvVar3;
        }
        else {
          iVar2 = (int)lVar7 - *(int *)((long)parser + 0x10);
          if (0x3ff < iVar2) {
            iVar2 = 0x400;
          }
          memcpy(pvVar3,(void *)(-iVar2 + lVar7),
                 (*(long *)((long)parser + 0x38) - lVar7) + (long)iVar2);
          (**(code **)((long)parser + 0x28))(*(undefined8 *)((long)parser + 0x10));
          *(void **)((long)parser + 0x10) = pvVar3;
          pvVar8 = (void *)((long)iVar2 + (long)pvVar3);
          *(long *)((long)parser + 0x38) =
               (*(long *)((long)parser + 0x38) - *(long *)((long)parser + 0x30)) + (long)pvVar8;
        }
        *(void **)((long)parser + 0x30) = pvVar8;
      }
      if (pvVar3 == (void *)0x0) {
        return (void *)0x0;
      }
    }
    else if ((long)iVar2 < lVar1 - (long)pvVar3) {
      lVar7 = (long)(iVar6 - iVar2);
      memmove(pvVar3,(void *)((long)pvVar3 + lVar7),lVar4 + iVar2);
      *(long *)((long)parser + 0x38) = *(long *)((long)parser + 0x38) - lVar7;
      *(long *)((long)parser + 0x30) = *(long *)((long)parser + 0x30) - lVar7;
    }
  }
  return *(void **)((long)parser + 0x38);
}

Assistant:

void *XML_GetBuffer(XML_Parser parser, int len)
{
  if (len > bufferLim - bufferEnd) {
    /* FIXME avoid integer overflow */
    int neededSize = len + (bufferEnd - bufferPtr);
#ifdef XML_CONTEXT_BYTES
    int keep = bufferPtr - buffer;

    if (keep > XML_CONTEXT_BYTES)
      keep = XML_CONTEXT_BYTES;
    neededSize += keep;
#endif  /* defined XML_CONTEXT_BYTES */
    if (neededSize  <= bufferLim - buffer) {
#ifdef XML_CONTEXT_BYTES
      if (keep < bufferPtr - buffer) {
        int offset = (bufferPtr - buffer) - keep;
        memmove(buffer, &buffer[offset], bufferEnd - bufferPtr + keep);
        bufferEnd -= offset;
        bufferPtr -= offset;
      }
#else
      memmove(buffer, bufferPtr, bufferEnd - bufferPtr);
      bufferEnd = buffer + (bufferEnd - bufferPtr);
      bufferPtr = buffer;
#endif  /* not defined XML_CONTEXT_BYTES */
    }
    else {
      char *newBuf;
      int bufferSize = bufferLim - bufferPtr;
      if (bufferSize == 0)
        bufferSize = INIT_BUFFER_SIZE;
      do {
        bufferSize *= 2;
      } while (bufferSize < neededSize);
      newBuf = MALLOC(bufferSize);
      if (newBuf == 0) {
        errorCode = XML_ERROR_NO_MEMORY;
        return 0;
      }
      bufferLim = newBuf + bufferSize;
#ifdef XML_CONTEXT_BYTES
      if (bufferPtr) {
        int xmKeep = bufferPtr - buffer;
        if (xmKeep > XML_CONTEXT_BYTES)
          xmKeep = XML_CONTEXT_BYTES;
        memcpy(newBuf, &bufferPtr[-xmKeep], bufferEnd - bufferPtr + xmKeep);
        FREE(buffer);
        buffer = newBuf;
        bufferEnd = buffer + (bufferEnd - bufferPtr) + xmKeep;
        bufferPtr = buffer + xmKeep;
      }
      else {
        bufferEnd = newBuf + (bufferEnd - bufferPtr);
        bufferPtr = buffer = newBuf;
      }
#else
      if (bufferPtr) {
        memcpy(newBuf, bufferPtr, bufferEnd - bufferPtr);
        FREE(buffer);
      }
      bufferEnd = newBuf + (bufferEnd - bufferPtr);
      bufferPtr = buffer = newBuf;
#endif  /* not defined XML_CONTEXT_BYTES */
    }
  }
  return bufferEnd;
}